

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

void Abc_CountZddCubes_rec(DdManager *dd,DdNode *zCover,int *pnCubes)

{
  DdNode *local_38;
  DdNode *zC2;
  DdNode *zC1;
  DdNode *zC0;
  int *pnCubes_local;
  DdNode *zCover_local;
  DdManager *dd_local;
  
  if (zCover != dd->zero) {
    if (zCover == dd->one) {
      *pnCubes = *pnCubes + 1;
    }
    else if (*pnCubes < 0x186a1) {
      zC0 = (DdNode *)pnCubes;
      pnCubes_local = (int *)zCover;
      zCover_local = &dd->sentinel;
      extraDecomposeCover(dd,zCover,&zC1,&zC2,&local_38);
      Abc_CountZddCubes_rec((DdManager *)zCover_local,zC1,(int *)zC0);
      Abc_CountZddCubes_rec((DdManager *)zCover_local,zC2,(int *)zC0);
      Abc_CountZddCubes_rec((DdManager *)zCover_local,local_38,(int *)zC0);
    }
  }
  return;
}

Assistant:

void Abc_CountZddCubes_rec( DdManager * dd, DdNode * zCover, int * pnCubes )
{
    DdNode * zC0, * zC1, * zC2;
    if ( zCover == dd->zero )
        return;
    if ( zCover == dd->one )
    {
        (*pnCubes)++;
        return;
    }
    if ( (*pnCubes) > ABC_MAX_CUBES )
        return;
    extraDecomposeCover( dd, zCover, &zC0, &zC1, &zC2 );
    Abc_CountZddCubes_rec( dd, zC0, pnCubes );
    Abc_CountZddCubes_rec( dd, zC1, pnCubes );
    Abc_CountZddCubes_rec( dd, zC2, pnCubes );
}